

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O1

void __thiscall
RegVmLoweredFunction::GetRegisters
          (RegVmLoweredFunction *this,SmallArray<unsigned_char,_32U> *result,VmValue *value)

{
  uchar uVar1;
  uint uVar2;
  VmValue *pVVar3;
  VmValue *pVVar4;
  ulong uVar5;
  
  if ((value == (VmValue *)0x0) || (pVVar4 = value, value->typeID != 2)) {
    pVVar4 = (VmValue *)0x0;
  }
  CompleteUse(this,value);
  if (*(int *)(pVVar4[1].users.little + 3) != 0) {
    if (*(int *)(pVVar4[1].users.little + 3) != 0) {
      uVar5 = 0;
      do {
        pVVar3 = pVVar4[1].users.little[2];
        if (result->count == result->max) {
          SmallArray<unsigned_char,_32U>::grow(result,result->count);
        }
        if (result->data == (uchar *)0x0) {
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,
                        "void SmallArray<unsigned char, 32>::push_back(const T &) [T = unsigned char, N = 32]"
                       );
        }
        uVar1 = *(uchar *)((long)(pVVar3->users).little + (uVar5 - 0x50));
        uVar2 = result->count;
        result->count = uVar2 + 1;
        result->data[uVar2] = uVar1;
        uVar5 = uVar5 + 1;
      } while (uVar5 < *(uint *)(pVVar4[1].users.little + 3));
    }
    return;
  }
  __assert_fail("!instruction->regVmRegisters.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                ,0xa4,
                "void RegVmLoweredFunction::GetRegisters(SmallArray<unsigned char, 32> &, VmValue *)"
               );
}

Assistant:

void RegVmLoweredFunction::GetRegisters(SmallArray<unsigned char, 32> &result, VmValue *value)
{
	VmInstruction *instruction = getType<VmInstruction>(value);

	CompleteUse(value);

	assert(!instruction->regVmRegisters.empty());

	for(unsigned i = 0; i < instruction->regVmRegisters.size(); i++)
		result.push_back(instruction->regVmRegisters[i]);
}